

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

char * duckdb_enum_dictionary_value(duckdb_logical_type type,idx_t index)

{
  Vector *this;
  string *psVar1;
  char *pcVar2;
  Value value;
  Value local_50;
  
  if ((type == (duckdb_logical_type)0x0) || (*type != (_duckdb_logical_type)0x68)) {
    pcVar2 = (char *)0x0;
  }
  else {
    this = duckdb::EnumType::GetValuesInsertOrder((LogicalType *)type);
    duckdb::Vector::GetValue(&local_50,this,index);
    psVar1 = duckdb::StringValue::Get_abi_cxx11_(&local_50);
    pcVar2 = strdup((psVar1->_M_dataplus)._M_p);
    duckdb::Value::~Value(&local_50);
  }
  return pcVar2;
}

Assistant:

char *duckdb_enum_dictionary_value(duckdb_logical_type type, idx_t index) {
	if (!AssertLogicalTypeId(type, duckdb::LogicalTypeId::ENUM)) {
		return nullptr;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	auto &vector = duckdb::EnumType::GetValuesInsertOrder(logical_type);
	auto value = vector.GetValue(index);
	return strdup(duckdb::StringValue::Get(value).c_str());
}